

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O0

void TIFFSwabDouble(double *dp)

{
  undefined1 uVar1;
  uchar t;
  uchar *cp;
  double *dp_local;
  
  uVar1 = *(undefined1 *)((long)dp + 7);
  *(undefined1 *)((long)dp + 7) = *(undefined1 *)dp;
  *(undefined1 *)dp = uVar1;
  uVar1 = *(undefined1 *)((long)dp + 6);
  *(undefined1 *)((long)dp + 6) = *(undefined1 *)((long)dp + 1);
  *(undefined1 *)((long)dp + 1) = uVar1;
  uVar1 = *(undefined1 *)((long)dp + 5);
  *(undefined1 *)((long)dp + 5) = *(undefined1 *)((long)dp + 2);
  *(undefined1 *)((long)dp + 2) = uVar1;
  uVar1 = *(undefined1 *)((long)dp + 4);
  *(undefined1 *)((long)dp + 4) = *(undefined1 *)((long)dp + 3);
  *(undefined1 *)((long)dp + 3) = uVar1;
  return;
}

Assistant:

void TIFFSwabDouble(double *dp)
{
    register unsigned char *cp = (unsigned char *)dp;
    unsigned char t;
    assert(sizeof(double) == 8);
    t = cp[7];
    cp[7] = cp[0];
    cp[0] = t;
    t = cp[6];
    cp[6] = cp[1];
    cp[1] = t;
    t = cp[5];
    cp[5] = cp[2];
    cp[2] = t;
    t = cp[4];
    cp[4] = cp[3];
    cp[3] = t;
}